

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::clara::TextFlow::Spacer::Spacer(Spacer *this,size_t spaceWidth)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  Column::Column(&this->super_Column,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (spaceWidth != 0) {
    (this->super_Column).m_width = spaceWidth;
    return;
  }
  __assert_fail("newWidth > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ricab[P]scope_guard/build_O1/_deps/catch2-src/single_include/catch2/catch.hpp"
                ,0x21a5,"Column &Catch::clara::TextFlow::Column::width(size_t)");
}

Assistant:

explicit Spacer(size_t spaceWidth) : Column("") {
		width(spaceWidth);
	}